

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qx509_base.cpp
# Opt level: O0

QStringList * __thiscall
QTlsPrivate::X509CertificateBase::subjectInfo(X509CertificateBase *this,SubjectInfo info)

{
  long *in_RSI;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  subjectInfoToString((SubjectInfo)((ulong)in_RSI >> 0x20));
  (**(code **)(*in_RSI + 0x50))(in_RDI,in_RSI,local_20);
  QByteArray::~QByteArray((QByteArray *)0x10525f);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList X509CertificateBase::subjectInfo(QSslCertificate::SubjectInfo info) const
{
    return subjectInfo(subjectInfoToString(info));
}